

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.hpp
# Opt level: O0

void __thiscall goodform::error_message::error_message(error_message *this,string *message)

{
  string *message_local;
  error_message *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)message);
  return;
}

Assistant:

error_message(const std::string& message) { this->message_ = message; }